

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::type_is_block_like(Compiler *this,SPIRType *type)

{
  bool bVar1;
  TypedID<(spirv_cross::Types)1> id;
  size_t sVar2;
  uint local_24;
  uint32_t i;
  SPIRType *type_local;
  Compiler *this_local;
  
  bVar1 = type_is_top_level_block(this,type);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    if (type->basetype == Struct) {
      for (local_24 = 0;
          sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
          local_24 < (uint)sVar2; local_24 = local_24 + 1) {
        id = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
        bVar1 = has_member_decoration(this,(TypeID)id.id,local_24,DecorationOffset);
        if (bVar1) {
          return true;
        }
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::type_is_block_like(const SPIRType &type) const
{
	if (type_is_top_level_block(type))
		return true;

	if (type.basetype == SPIRType::Struct)
	{
		// Block-like types may have Offset decorations.
		for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
			if (has_member_decoration(type.self, i, DecorationOffset))
				return true;
	}

	return false;
}